

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::TextureLevelPyramid::allocLevel
          (TextureLevelPyramid *this,int levelNdx,int width,int height,int depth)

{
  int height_00;
  int width_00;
  int iVar1;
  reference pvVar2;
  void *data;
  reference __dest;
  PixelBufferAccess local_50;
  int local_24;
  int local_20;
  int size;
  int depth_local;
  int height_local;
  int width_local;
  int levelNdx_local;
  TextureLevelPyramid *this_local;
  
  local_20 = depth;
  size = height;
  depth_local = width;
  height_local = levelNdx;
  _width_local = this;
  iVar1 = TextureFormat::getPixelSize(&this->m_format);
  local_24 = iVar1 * depth_local * size * local_20;
  pvVar2 = std::
           vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ::operator[](&this->m_data,(long)height_local);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage(pvVar2,(long)local_24);
  width_00 = depth_local;
  height_00 = size;
  iVar1 = local_20;
  pvVar2 = std::
           vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ::operator[](&this->m_data,(long)height_local);
  data = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(pvVar2);
  PixelBufferAccess::PixelBufferAccess(&local_50,&this->m_format,width_00,height_00,iVar1,data);
  __dest = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::operator[]
                     (&this->m_access,(long)height_local);
  memcpy(__dest,&local_50,0x28);
  return;
}

Assistant:

void TextureLevelPyramid::allocLevel (int levelNdx, int width, int height, int depth)
{
	const int	size	= m_format.getPixelSize()*width*height*depth;

	DE_ASSERT(isLevelEmpty(levelNdx));

	m_data[levelNdx].setStorage(size);
	m_access[levelNdx] = PixelBufferAccess(m_format, width, height, depth, m_data[levelNdx].getPtr());
}